

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryUnshift(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *pTVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  double value;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  Var pvVar9;
  JavascriptArray *pJVar10;
  ScriptContext *pSVar11;
  JavascriptCopyOnAccessNativeIntArray *this;
  uint64 uVar12;
  uint64 uVar13;
  uint32 unshiftElements;
  SparseArraySegmentBase *pSVar14;
  uint uVar15;
  int in_stack_00000010;
  BigIndex local_88;
  CallInfo local_78;
  CallInfo callInfo_local;
  JsReentLock jsReentLock;
  ArgumentReader args;
  
  pSVar11 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  local_78 = callInfo;
  ThreadContext::ProbeStack(pSVar11->threadContext,0xc00,pSVar11,(PVOID)0x0);
  if (in_stack_00000010 != local_78._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1f5d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b8b521;
    *puVar8 = 0;
  }
  jsReentLock._24_8_ = local_78;
  ArgumentReader::AdjustArguments((ArgumentReader *)&jsReentLock.m_savedNoJsReentrancy,&local_78);
  pSVar11 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  callInfo_local = (CallInfo)pSVar11->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = *(bool *)((long)callInfo_local + 0x108);
  *(bool *)((long)callInfo_local + 0x108) = true;
  pvVar9 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&callInfo_local,pvVar9);
  if (((ulong)local_78 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1f62,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00b8b521;
    *puVar8 = 0;
  }
  if ((jsReentLock._24_8_ & 0xffffff) == 0) {
    pSVar11 = (ScriptContext *)
              (((pSVar11->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
    goto LAB_00b8b502;
  }
  pvVar9 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
  bVar5 = IsNonES5Array(pvVar9);
  if (bVar5) {
    pvVar9 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
    pJVar10 = VarTo<Js::JavascriptArray>(pvVar9);
    iVar7 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar10);
    if (iVar7 != 0) goto LAB_00b8b0fa;
    pvVar9 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
    if (pvVar9 != (Var)0x0) {
      bVar5 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar9);
      if (bVar5) {
        this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar9);
      }
      else {
        this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
    }
    pvVar9 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
    pJVar10 = VarTo<Js::JavascriptArray>(pvVar9);
  }
  else {
LAB_00b8b0fa:
    pJVar10 = (JavascriptArray *)0x0;
  }
  if (pJVar10 == (JavascriptArray *)0x0) {
LAB_00b8b129:
    *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pSVar11 = (ScriptContext *)
              UnshiftObjectHelper((Arguments *)&jsReentLock.m_savedNoJsReentrancy,pSVar11);
    goto LAB_00b8b502;
  }
  uVar15 = jsReentLock._24_4_ & 0xffffff;
  unshiftElements = uVar15 - 1;
  if (unshiftElements != 0) {
    bVar5 = HasAnyES5ArrayInPrototypeChain(pJVar10,true);
    if (bVar5) goto LAB_00b8b129;
    uVar2 = (pJVar10->super_ArrayObject).length;
    bVar5 = IsFillFromPrototypes(pJVar10);
    if (bVar5) {
      FillFromPrototypes(pJVar10,0,(pJVar10->super_ArrayObject).length);
    }
    uVar3 = (pJVar10->super_ArrayObject).length;
    if (uVar2 != uVar3) {
      Throw::FatalInternalError(-0x7fffbffb);
    }
    uVar15 = -uVar15;
    if (uVar15 < uVar3) {
      EnsureNonNativeArray(pJVar10);
      *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BigIndex::BigIndex(&local_88,0xffffffff);
      TruncateToProperties(pJVar10,&local_88,uVar15);
      JsReentLock::MutateArrayObject((JsReentLock *)&callInfo_local);
      *(undefined1 *)((long)callInfo_local + 0x108) = 1;
      if ((pJVar10->super_ArrayObject).length + unshiftElements != -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1f93,"(pArr->length + unshiftElements == MaxArrayLength)",
                                    "pArr->length + unshiftElements == MaxArrayLength");
        if (!bVar5) goto LAB_00b8b521;
        *puVar8 = 0;
      }
      bVar5 = VarIs<Js::ES5Array,Js::JavascriptArray>(pJVar10);
      if (!bVar5) goto LAB_00b8b2a2;
      *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pSVar11 = (ScriptContext *)
                UnshiftObjectHelper((Arguments *)&jsReentLock.m_savedNoJsReentrancy,pSVar11);
      bVar5 = false;
    }
    else {
LAB_00b8b2a2:
      ClearSegmentMap(pJVar10);
      if (uVar15 < (pJVar10->super_ArrayObject).length) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1f9c,"(pArr->length <= MaxArrayLength - unshiftElements)",
                                    "pArr->length <= MaxArrayLength - unshiftElements");
        if (!bVar5) goto LAB_00b8b521;
        *puVar8 = 0;
      }
      bVar5 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar10);
      if (bVar5) {
        bVar6 = false;
      }
      else {
        bVar6 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar10);
      }
      pSVar14 = (pJVar10->head).ptr;
      if (pSVar14->size < pSVar14->length + unshiftElements) {
        if (bVar5) {
          GrowArrayHeadHelperForUnshift<int>(pJVar10,unshiftElements,pSVar11);
        }
        else if (bVar6 == false) {
          GrowArrayHeadHelperForUnshift<void*>(pJVar10,unshiftElements,pSVar11);
        }
        else {
          GrowArrayHeadHelperForUnshift<double>(pJVar10,unshiftElements,pSVar11);
        }
      }
      for (pSVar14 = (((pJVar10->head).ptr)->next).ptr; pSVar14 != (SparseArraySegmentBase *)0x0;
          pSVar14 = (pSVar14->next).ptr) {
        pSVar14->left = pSVar14->left + unshiftElements;
        if ((pSVar14->next).ptr == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(pSVar14);
        }
      }
      if (bVar5) {
        UnshiftHelper<int>(pJVar10,unshiftElements,(Var *)&stack0x00000018);
      }
      else if (bVar6 == false) {
        UnshiftHelper<void*>(pJVar10,unshiftElements,(Var *)&stack0x00000018);
      }
      else {
        UnshiftHelper<double>(pJVar10,unshiftElements,(Var *)&stack0x00000018);
      }
      SetLastUsedSegment(pJVar10,(pJVar10->head).ptr);
      pTVar1 = &(pJVar10->super_ArrayObject).length;
      *pTVar1 = *pTVar1 + unshiftElements;
      ClearSegmentMap(pJVar10);
      (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])
                (pJVar10);
      if (uVar15 < uVar3) {
        JavascriptError::ThrowRangeError(pSVar11,-0x7ff5ec5a,(PCWSTR)0x0);
      }
      bVar5 = true;
    }
    if (!bVar5) goto LAB_00b8b502;
  }
  uVar15 = (pJVar10->super_ArrayObject).length;
  if ((long)(int)uVar15 < 0) {
    value = (double)uVar15;
    uVar12 = NumberUtilities::ToSpecial(value);
    bVar5 = NumberUtilities::IsNan(value);
    if (bVar5) {
      uVar13 = NumberUtilities::ToSpecial(value);
      if (uVar13 != 0xfff8000000000000) {
        uVar13 = NumberUtilities::ToSpecial(value);
        if (uVar13 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar5) {
LAB_00b8b521:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar8 = 0;
        }
      }
    }
    pSVar11 = (ScriptContext *)(uVar12 ^ 0xfffc000000000000);
  }
  else {
    pSVar11 = (ScriptContext *)((long)(int)uVar15 | 0x1000000000000);
  }
LAB_00b8b502:
  *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pSVar11;
}

Assistant:

Var JavascriptArray::EntryUnshift(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Unshift);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
           return res;
        }

        JavascriptArray * pArr = nullptr;
        if (JavascriptArray::IsNonES5Array(args[0])
            && !VarTo<JavascriptArray>(args[0])->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[0]);
#endif
            pArr = VarTo<JavascriptArray>(args[0]);
        }

        uint32 unshiftElements = args.Info.Count - 1;

        // forceCheckProtoChain - since the array expand to accommodate new items thus we have to check if we have accessor on the proto chain.
        bool useNoSideEffectUnshift = pArr != nullptr && (unshiftElements == 0 || !HasAnyES5ArrayInPrototypeChain(pArr, true /*forceCheckProtoChain*/));

        if (useNoSideEffectUnshift)
        {
            if (unshiftElements > 0)
            {
                uint32 length = pArr->length;
                if (pArr->IsFillFromPrototypes())
                {
                    pArr->FillFromPrototypes(0, pArr->length); // We need find all missing value from [[proto]] object
                }

                // As we have already established that the FillFromPrototype should not change the bound of the array.
                if (length != pArr->length)
                {
                    Js::Throw::FatalInternalError();
                }

                // Pre-process: truncate overflowing elements to properties
                bool newLenOverflowed = false;
                uint32 maxLen = MaxArrayLength - unshiftElements;
                if (pArr->length > maxLen)
                {
                    newLenOverflowed = true;
                    // Ensure the array is non-native when overflow happens
                    EnsureNonNativeArray(pArr);
                    JS_REENTRANT(jsReentLock, pArr->TruncateToProperties(MaxArrayLength, maxLen));
                    Assert(pArr->length + unshiftElements == MaxArrayLength);
                    if (VarIs<ES5Array>(pArr))
                    {
                        JS_REENTRANT_UNLOCK(jsReentLock, return UnshiftObjectHelper(args, scriptContext));
                    }
                }

                pArr->ClearSegmentMap(); // Dump segmentMap on unshift (before any possible allocation and throw)

                Assert(pArr->length <= MaxArrayLength - unshiftElements);
                bool isIntArray = false;
                bool isFloatArray = false;

                if (VarIs<JavascriptNativeIntArray>(pArr))
                {
                    isIntArray = true;
                }
                else if (VarIs<JavascriptNativeFloatArray>(pArr))
                {
                    isFloatArray = true;
                }

                // If we need to grow head segment and there is already a next segment, then allocate the new head segment upfront
                // If there is OOM in array allocation, then array consistency is maintained.
                if (pArr->head->size < pArr->head->length + unshiftElements)
                {
                    if (isIntArray)
                    {
                        GrowArrayHeadHelperForUnshift<int32>(pArr, unshiftElements, scriptContext);
                    }
                    else if (isFloatArray)
                    {
                        GrowArrayHeadHelperForUnshift<double>(pArr, unshiftElements, scriptContext);
                    }
                    else
                    {
                        GrowArrayHeadHelperForUnshift<Var>(pArr, unshiftElements, scriptContext);
                    }
                }

                SparseArraySegmentBase* renumberSeg = pArr->head->next;

                while (renumberSeg)
                {
                    renumberSeg->left += unshiftElements;
                    if (renumberSeg->next == nullptr)
                    {
                        // last segment can shift its left + size beyond MaxArrayLength, so truncate if so
                        renumberSeg->EnsureSizeInBound();
                    }
                    renumberSeg = renumberSeg->next;
                }

                try
                {
                    if (isIntArray)
                    {
                        UnshiftHelper<int32>(pArr, unshiftElements, args.Values);
                    }
                    else if (isFloatArray)
                    {
                        UnshiftHelper<double>(pArr, unshiftElements, args.Values);
                    }
                    else
                    {
                        UnshiftHelper<Var>(pArr, unshiftElements, args.Values);
                    }
                }
                catch (...)
                {
                    Js::Throw::FatalInternalError();
                }

                pArr->InvalidateLastUsedSegment();
                pArr->length += unshiftElements;
                pArr->ClearSegmentMap();

#ifdef VALIDATE_ARRAY
                pArr->ValidateArray();
#endif

                if (newLenOverflowed) // ES5: throw if new "length" exceeds max array length
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
                }
            }
            res = JavascriptNumber::ToVar(pArr->length, scriptContext);
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, res = UnshiftObjectHelper(args, scriptContext));
        }
        return res;
        JIT_HELPER_END(Array_Unshift);
    }